

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_tinning_kit(obj *obj)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  obj *obj_00;
  char *pcVar4;
  obj *obj_01;
  char local_228 [8];
  char kbuf [256];
  char premsg [256];
  obj *can;
  obj *corpse;
  obj *obj_local;
  
  if (obj->spe < '\x01') {
    pline("You seem to be out of tins.");
    obj_local._4_4_ = 1;
  }
  else {
    obj_00 = floorfood("tin");
    if (obj_00 == (obj *)0x0) {
      obj_local._4_4_ = 0;
    }
    else if ((obj_00->otyp == 0x10e) &&
            ((obj_00->oeaten != 0 || ((*(uint *)&obj_00->field_0x4a >> 0x1b & 1) != 0)))) {
      pline("You cannot tin something which is partly eaten.");
      obj_local._4_4_ = 0;
    }
    else {
      if (((((long)obj_00->corpsenm & 0x3ffffffffffffffU) == 0xc) ||
          (((long)obj_00->corpsenm & 0x3ffffffffffffffU) == 0xb)) &&
         (((u.uprops[8].extrinsic == 0 && ((youmonst.mintrinsics & 0x80) == 0)) &&
          (uarmg == (obj *)0x0)))) {
        memset(kbuf + 0xf8,0,0x100);
        memset(local_228,0,0x100);
        bVar1 = poly_when_stoned(youmonst.data);
        if (bVar1 == '\0') {
          pcVar4 = mons_mname(mons + obj_00->corpsenm);
          pcVar4 = an(pcVar4);
          snprintf(kbuf + 0xf8,0x100,"Tinning %s without wearing gloves is a fatal mistake...",
                   pcVar4);
          pcVar4 = mons_mname(mons + obj_00->corpsenm);
          pcVar4 = an(pcVar4);
          snprintf(local_228,0x100,"trying to tin %s without gloves",pcVar4);
        }
        else {
          pcVar4 = mons_mname(mons + obj_00->corpsenm);
          pcVar4 = an(pcVar4);
          pline("You start tinning %s without wearing gloves.",pcVar4);
        }
        bVar1 = delayed_petrify(kbuf + 0xf8,local_228);
        if (bVar1 != '\0') {
          pline("You stop your tinning attempt.");
          return 1;
        }
      }
      if (((((long)obj_00->corpsenm & 0x3ffffffffffffffU) == 0x144) ||
          (((long)obj_00->corpsenm & 0x3ffffffffffffffU) == 0x146)) ||
         (((long)obj_00->corpsenm & 0x3ffffffffffffffU) == 0x145)) {
        revive_corpse(obj_00);
        verbalize("Yes...  But War does not preserve its enemies...");
        obj_local._4_4_ = 1;
      }
      else if (mons[obj_00->corpsenm].cnutrit == 0) {
        pline("That\'s too insubstantial to tin.");
        obj_local._4_4_ = 0;
      }
      else {
        consume_obj_charge(obj,'\x01');
        obj_01 = mksobj(level,0x129,'\0','\0');
        if (obj_01 == (obj *)0x0) {
          warning("Tinning failed.");
        }
        else {
          iVar2 = undead_to_corpse(obj_00->corpsenm);
          obj_01->corpsenm = iVar2;
          *(uint *)&obj_01->field_0x4a =
               *(uint *)&obj_01->field_0x4a & 0xfffffffe | *(uint *)&obj->field_0x4a & 1;
          *(uint *)&obj_01->field_0x4a =
               *(uint *)&obj_01->field_0x4a & 0xfffffffd | (*(uint *)&obj->field_0x4a >> 1 & 1) << 1
          ;
          uVar3 = weight(obj_01);
          obj_01->owt = uVar3;
          *(uint *)&obj_01->field_0x4a = *(uint *)&obj_01->field_0x4a & 0xffffffef | 0x10;
          obj_01->spe = -1;
          if (obj_00->where == '\x03') {
            if ((*(uint *)&obj_00->field_0x4a >> 2 & 1) != 0) {
              verbalize("You tin it, you bought it!");
            }
            useup(obj_00);
          }
          else {
            bVar1 = costly_spot(obj_00->ox,obj_00->oy);
            if ((bVar1 != '\0') && ((*(uint *)&obj_00->field_0x4a >> 3 & 1) == 0)) {
              verbalize("You tin it, you bought it!");
            }
            useupf(obj_00,1);
          }
          pcVar4 = doname(obj_01);
          hold_another_object(obj_01,"You make, but cannot pick up, %s.",pcVar4,(char *)0x0);
        }
        obj_local._4_4_ = 1;
      }
    }
  }
  return obj_local._4_4_;
}

Assistant:

static int use_tinning_kit(struct obj *obj)
{
	struct obj *corpse, *can;

	/* This takes only 1 move.  If this is to be changed to take many
	 * moves, we've got to deal with decaying corpses...
	 */
	if (obj->spe <= 0) {
		pline("You seem to be out of tins.");
		return 1;
	}
	if (!(corpse = floorfood("tin"))) return 0;
	if (corpse->otyp == CORPSE && (corpse->oeaten || corpse->odrained)) {
		pline("You cannot tin something which is partly eaten.");
		return 0;
	}
	if (touch_petrifies(&mons[corpse->corpsenm])
		&& !Stone_resistance && !uarmg) {
	    char premsg[BUFSZ] = "";
	    char kbuf[BUFSZ] = "";
	    if (poly_when_stoned(youmonst.data)) {
		pline("You start tinning %s without wearing gloves.",
			an(mons_mname(&mons[corpse->corpsenm])));
	    } else {
		snprintf(premsg, BUFSZ,
			 "Tinning %s without wearing gloves is a fatal mistake...",
			 an(mons_mname(&mons[corpse->corpsenm])));
		snprintf(kbuf, BUFSZ,
			 "trying to tin %s without gloves",
			 an(mons_mname(&mons[corpse->corpsenm])));
	    }
	    if (delayed_petrify(premsg, kbuf)) {
		pline("You stop your tinning attempt.");
		return 1;
	    }
	}
	if (is_rider(&mons[corpse->corpsenm])) {
		revive_corpse(corpse);
		verbalize("Yes...  But War does not preserve its enemies...");
		return 1;
	}
	if (mons[corpse->corpsenm].cnutrit == 0) {
		pline("That's too insubstantial to tin.");
		return 0;
	}
	consume_obj_charge(obj, TRUE);

	if ((can = mksobj(level, TIN, FALSE, FALSE)) != 0) {
	    static const char you_buy_it[] = "You tin it, you bought it!";

	    /* Permit giant zombies to still produce tins of giant meat. */
	    can->corpsenm = undead_to_corpse(corpse->corpsenm);
	    can->cursed = obj->cursed;
	    can->blessed = obj->blessed;
	    can->owt = weight(can);
	    can->known = 1;
	    can->spe = -1;  /* Mark tinned tins. No spinach allowed... */
	    if (carried(corpse)) {
		if (corpse->unpaid)
		    verbalize(you_buy_it);
		useup(corpse);
	    } else {
		if (costly_spot(corpse->ox, corpse->oy) && !corpse->no_charge)
		    verbalize(you_buy_it);
		useupf(corpse, 1L);
	    }
	    hold_another_object(can, "You make, but cannot pick up, %s.",
				doname(can), NULL);
	} else warning("Tinning failed.");
	return 1;
}